

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.c
# Opt level: O1

int loader_handle_populate(void *handle_dest,void *handle_src)

{
  int iVar1;
  int iVar2;
  context src;
  context dest;
  vector v;
  char *duplicated_key;
  void *local_30;
  char *local_28;
  
  local_30 = handle_dest;
  src = loader_impl_handle_context(handle_dest);
  dest = loader_impl_handle_context(handle_src);
  iVar1 = context_contains(dest,src,&local_28);
  if (local_28 == (char *)0x0 || iVar1 != 0) {
    iVar1 = context_append(src,dest);
    iVar2 = 1;
    if (iVar1 == 0) {
      v = loader_impl_handle_populated(handle_src);
      vector_push_back(v,&local_30);
      iVar2 = 0;
    }
  }
  else {
    log_write_impl_va("metacall",0x26d,"loader_handle_populate",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader.c"
                      ,LOG_LEVEL_ERROR,
                      "Duplicated symbol found named \'%s\' already defined in the handle scope",
                      local_28);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int loader_handle_populate(void *handle_dest, void *handle_src)
{
	context ctx_dest = loader_impl_handle_context(handle_dest);
	context ctx_src = loader_impl_handle_context(handle_src);
	char *duplicated_key;

	if (context_contains(ctx_src, ctx_dest, &duplicated_key) == 0 && duplicated_key != NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Duplicated symbol found named '%s' already defined in the handle scope", duplicated_key);
		return 1;
	}
	else if (context_append(ctx_dest, ctx_src) == 0)
	{
		vector_push_back_var(loader_impl_handle_populated(handle_src), handle_dest);

		return 0;
	}

	return 1;
}